

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase74::TestCase74(TestCase74 *this)

{
  TestCase74 *this_local;
  
  kj::TestCase::TestCase
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0x4a,"legacy test: Orphans/AdoptNullStruct");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_005c15d0;
  return;
}

Assistant:

TEST(Orphans, AdoptNullStruct) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();
  auto anyPointer = root.getAnyPointerField();
  EXPECT_TRUE(anyPointer.isNull());
  anyPointer.initAs<TestAllTypes>();
  anyPointer.adopt(Orphan<test::TestEmptyStruct>());
  EXPECT_EQ(0, anyPointer.targetSize().wordCount);
  EXPECT_TRUE(anyPointer.isNull());
}